

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

bool __thiscall moira::Moira::cond<(moira::Instr)107>(Moira *this)

{
  bool bVar1;
  Moira *this_local;
  
  bVar1 = evalCond<(moira::Cond)2>(this);
  return bVar1;
}

Assistant:

bool
Moira::cond() {

    switch (I) {

        case Instr::BRA: case Instr::ST:  case Instr::DBT:  case Instr::DBT_LOOP:  case Instr::TRAPT:  return evalCond<Cond::BT>();
        case Instr::SF:            case Instr::DBF:  case Instr::DBF_LOOP:  case Instr::TRAPF:  return evalCond<Cond::BF>();
        case Instr::BHI: case Instr::SHI: case Instr::DBHI: case Instr::DBHI_LOOP: case Instr::TRAPHI: return evalCond<Cond::HI>();
        case Instr::BLS: case Instr::SLS: case Instr::DBLS: case Instr::DBLS_LOOP: case Instr::TRAPLS: return evalCond<Cond::LS>();
        case Instr::BCC: case Instr::SCC: case Instr::DBCC: case Instr::DBCC_LOOP: case Instr::TRAPCC: return evalCond<Cond::CC>();
        case Instr::BCS: case Instr::SCS: case Instr::DBCS: case Instr::DBCS_LOOP: case Instr::TRAPCS: return evalCond<Cond::CS>();
        case Instr::BNE: case Instr::SNE: case Instr::DBNE: case Instr::DBNE_LOOP: case Instr::TRAPNE: return evalCond<Cond::NE>();
        case Instr::BEQ: case Instr::SEQ: case Instr::DBEQ: case Instr::DBEQ_LOOP: case Instr::TRAPEQ: return evalCond<Cond::EQ>();
        case Instr::BVC: case Instr::SVC: case Instr::DBVC: case Instr::DBVC_LOOP: case Instr::TRAPVC: return evalCond<Cond::VC>();
        case Instr::BVS: case Instr::SVS: case Instr::DBVS: case Instr::DBVS_LOOP: case Instr::TRAPVS: return evalCond<Cond::VS>();
        case Instr::BPL: case Instr::SPL: case Instr::DBPL: case Instr::DBPL_LOOP: case Instr::TRAPPL: return evalCond<Cond::PL>();
        case Instr::BMI: case Instr::SMI: case Instr::DBMI: case Instr::DBMI_LOOP: case Instr::TRAPMI: return evalCond<Cond::MI>();
        case Instr::BGE: case Instr::SGE: case Instr::DBGE: case Instr::DBGE_LOOP: case Instr::TRAPGE: return evalCond<Cond::GE>();
        case Instr::BLT: case Instr::SLT: case Instr::DBLT: case Instr::DBLT_LOOP: case Instr::TRAPLT: return evalCond<Cond::LT>();
        case Instr::BGT: case Instr::SGT: case Instr::DBGT: case Instr::DBGT_LOOP: case Instr::TRAPGT: return evalCond<Cond::GT>();
        case Instr::BLE: case Instr::SLE: case Instr::DBLE: case Instr::DBLE_LOOP: case Instr::TRAPLE: return evalCond<Cond::LE>();

        default:
            fatalError;
    }
}